

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

ulong __thiscall nuraft::raft_server::create_snapshot(raft_server *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  long in_RDI;
  uint64_t committed_idx;
  undefined1 in_stack_000002ff;
  ulong in_stack_00000300;
  raft_server *in_stack_00000308;
  __int_type local_60;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffa8;
  string local_30 [32];
  __int_type local_10;
  
  local_10 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffa8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d56df);
    iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d5702);
      msg_if_given_abi_cxx11_((char *)local_30,"manually create a snapshot on %lu",local_10);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"create_snapshot",0x1d4,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  bVar1 = snapshot_and_compact(in_stack_00000308,in_stack_00000300,(bool)in_stack_000002ff);
  if (bVar1) {
    local_60 = local_10;
  }
  else {
    local_60 = 0;
  }
  return local_60;
}

Assistant:

ulong raft_server::create_snapshot() {
    uint64_t committed_idx = sm_commit_index_;
    p_in("manually create a snapshot on %" PRIu64 "", committed_idx);
    return snapshot_and_compact(committed_idx, true) ? committed_idx : 0;
}